

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_sampling_superalphabet_vector_block(uchar **strings,size_t n)

{
  uchar *ptr;
  bool bVar1;
  uint16_t uVar2;
  ostream *poVar3;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *root;
  undefined8 *puVar4;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *this;
  ulong uVar5;
  pointer in_RCX;
  long lVar6;
  size_t depth;
  ulong uVar7;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"pseudo_sample");
  poVar3 = std::operator<<(poVar3,"(): sampling ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," strings ...\n");
  root = (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = 2000;
  for (uVar5 = 0; uVar5 < n; uVar5 = uVar5 + 0x2000) {
    ptr = strings[uVar5];
    depth = 0;
    this = root;
    while( true ) {
      uVar2 = get_char<unsigned_short>(ptr,depth);
      if ((char)uVar2 == '\0') break;
      TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::extend(this,uVar2 + 1);
      bVar1 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::is_trie
                        (this,(uint)uVar2);
      if (!bVar1) {
        puVar4 = (undefined8 *)operator_new(0x18);
        *puVar4 = 0;
        puVar4[1] = 0;
        puVar4[2] = 0;
        in_RCX = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)((uint)uVar2 * 8);
        *(undefined8 **)((long)in_RCX + uVar7) = puVar4;
        make_trie((void **)(uVar7 + (long)(this->_buckets).
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start));
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) goto LAB_001f0527;
      }
      this = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_node
                       (this,(uint)uVar2);
      depth = depth + 2;
      if (this == (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xd9,
                      "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = vector_block<unsigned char *, 128>]"
                     );
      }
    }
  }
LAB_001f0527:
  insert<32768u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_short>,unsigned_short>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_short>
            (root,strings,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_vector_block(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}